

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

ssize_t __thiscall memory_io_buf::read_file(memory_io_buf *this,int f,void *buf,size_t nbytes)

{
  size_type sVar1;
  char *__first;
  char *pcVar2;
  size_t in_RCX;
  char *in_RDI;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xa8));
  __first = (char *)min(in_RCX,sVar1 - *(long *)(in_RDI + 0xc0));
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1a9104);
  pcVar2 = pcVar2 + *(long *)(in_RDI + 0xc0);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1a9121);
  std::copy<char*,char*>(__first,in_RDI,pcVar2);
  *(char **)(in_RDI + 0xc0) = __first + *(long *)(in_RDI + 0xc0);
  return (ssize_t)__first;
}

Assistant:

virtual ssize_t read_file(int f, void* buf, size_t nbytes) {
        nbytes = min(nbytes, data.size()-readOffset);
        copy(data.data()+readOffset, data.data()+readOffset+nbytes, reinterpret_cast<char *>(buf));
        readOffset += nbytes;
        return nbytes;
    }